

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall ON_PolyCurve::Read(ON_PolyCurve *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int segment_count;
  ON_Object *obj;
  int reserved2;
  int reserved1;
  ON_Curve *crv;
  int minor_version;
  int major_version;
  ON_BoundingBox bbox;
  ON__INT32 local_84;
  ON_Object *local_80;
  ON__INT32 local_78 [2];
  ON_Curve *local_70;
  int local_68 [2];
  ON_BoundingBox local_60;
  
  ON_CurveArray::Destroy(&this->m_segment);
  ON_SimpleArray<double>::SetCapacity(&this->m_t,0);
  local_68[1] = 0;
  local_68[0] = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,local_68 + 1,local_68);
  if (!bVar1) {
    return false;
  }
  local_84 = 0;
  local_78[1] = 0;
  local_78[0] = 0;
  bVar1 = ON_BinaryArchive::ReadInt(file,&local_84);
  if (((bVar1) && (bVar1 = ON_BinaryArchive::ReadInt(file,local_78 + 1), bVar1)) &&
     (bVar1 = ON_BinaryArchive::ReadInt(file,local_78), bVar1)) {
    ON_BoundingBox::ON_BoundingBox(&local_60);
    bVar1 = ON_BinaryArchive::ReadBoundingBox(file,&local_60);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_t);
      if (local_84 < 1 || !bVar1) {
        if (!bVar1) {
          return false;
        }
      }
      else {
        iVar4 = 0;
        do {
          local_80 = (ON_Object *)0x0;
          local_70 = (ON_Curve *)0x0;
          iVar2 = ON_BinaryArchive::ReadObject(file,&local_80);
          if (iVar2 == 0) {
            return false;
          }
          local_70 = ON_Curve::Cast(local_80);
          if (local_70 == (ON_Curve *)0x0) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_polycurve.cpp"
                       ,0x1e1,"","ON_PolyCurve::Read() - non ON_Curve object in segment list\n");
            if (local_80 == (ON_Object *)0x0) {
              return false;
            }
            (*local_80->_vptr_ON_Object[4])();
            return false;
          }
          ON_SimpleArray<ON_Curve_*>::Append
                    (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,&local_70);
          iVar4 = iVar4 + 1;
        } while (iVar4 < local_84);
      }
      iVar4 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
      if ((iVar4 == local_84 && 0 < iVar4) && ((this->m_t).m_count == local_84 + 1)) {
        SanitizeDomain(this);
      }
      uVar3 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
      if (uVar3 < 0xbf065d0) {
        RemoveNesting(this);
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_PolyCurve::Read(
       ON_BinaryArchive& file  // open binary file
     )
{
  // NOTE - if changed, check legacy I/O code
  Destroy();
  int major_version = 0;
  int minor_version = 0;
  
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  
  if (rc) 
  {
    ON_Object* obj;
    ON_Curve* crv;
    int segment_index;
    int segment_count = 0;
    int reserved1 = 0;
    int reserved2 = 0;
    rc = file.ReadInt(&segment_count);
    if (rc) rc = file.ReadInt(&reserved1);
    if (rc) rc = file.ReadInt(&reserved2);
    if (rc) {
      // may be set in future
      ON_BoundingBox bbox;
      rc = file.ReadBoundingBox(bbox);
    }
    if (rc) rc = file.ReadArray( m_t );

    for ( segment_index = 0; segment_index < segment_count && rc; segment_index++ ) {
      obj = 0;
      crv = 0;
      rc = file.ReadObject( &obj );
      if (rc) {
        crv = ON_Curve::Cast(obj);
        if (crv) {
          //Append(crv); - this one adds to m_t[]
          m_segment.Append(crv);
        }
        else {
          ON_ERROR("ON_PolyCurve::Read() - non ON_Curve object in segment list\n");
          delete obj;
          rc = false;
        }
      }
    }

    if ( rc && m_segment.Count()>0 && 
								m_segment.Count()==segment_count && m_t.Count()==segment_count+1)
    {
      // remove "fuzz" in m_t[] domain array that is in some older files.
      SanitizeDomain();
      /*
      double s, t, d0, d1, fuzz;
      ON_Interval in0, in1;
      in1 = SegmentCurve(0)->Domain();
      d1 = in1.Length();
      for ( segment_index = 1; segment_index < segment_count; segment_index++ )
      {
        t = m_t[segment_index];
        in0 = in1;
        d0 = d1;
        in1 = SegmentCurve(segment_index)->Domain();
        d1 = in1.Length();
        s = in0[1];
        if ( s != t && s == in1[0] && t > in0[0] && t < in1[1] )
        {
          fuzz = ((d0<=d1)?d0:d1)*ON_SQRT_EPSILON;
          if ( fabs(t-s) <= fuzz )
            m_t[segment_index] = s;
        }
      }
      fuzz = d1*ON_SQRT_EPSILON;
      t = m_t[segment_count];
      s = in1[1];
      if ( s != t && t > in1[0] && fabs(s-t) <= fuzz )
        m_t[segment_count] = s;
        */
    }
  }

  if (rc && file.ArchiveOpenNURBSVersion() < 200304080 )
  {
    // 8 April 2003 Dale Lear:
    //   Some archives written by earlier versions
    //   of Rhino had nested polycurves and polycurves with
    //   zero length segments.  This code cleans up
    //   those problems.  See RR 8932.
    RemoveNesting();
    //RemoveShortSegments(ON_ZERO_TOLERANCE);
  }

  return rc;
}